

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O0

void __thiscall Generation::commit(Generation *this)

{
  undefined1 uVar1;
  File *in_RDI;
  bool bOK;
  unsigned_long onDisk;
  File genFile;
  MutexLocker lock;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff61;
  undefined1 in_stack_ffffffffffffff62;
  undefined1 in_stack_ffffffffffffff63;
  undefined1 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  File *in_stack_ffffffffffffff78;
  File *pFVar2;
  File *this_00;
  undefined1 in_stack_ffffffffffffff87;
  File *in_stack_ffffffffffffff88;
  string local_70 [32];
  _func_int **in_stack_ffffffffffffffb0;
  File *in_stack_ffffffffffffffb8;
  unsigned_long in_stack_ffffffffffffffc0;
  File *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe1;
  undefined1 in_stack_ffffffffffffffe2;
  undefined1 in_stack_ffffffffffffffe3;
  int in_stack_ffffffffffffffe4;
  File *in_stack_ffffffffffffffe8;
  File *in_stack_fffffffffffffff0;
  
  if ((in_RDI->field_0x2c & 1) != 0) {
    MutexLocker::MutexLocker
              ((MutexLocker *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT15(in_stack_ffffffffffffff65,
                                          CONCAT14(in_stack_ffffffffffffff64,
                                                   CONCAT13(in_stack_ffffffffffffff63,
                                                            CONCAT12(in_stack_ffffffffffffff62,
                                                                     CONCAT11(
                                                  in_stack_ffffffffffffff61,
                                                  in_stack_ffffffffffffff60))))))),
               (Mutex *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::__cxx11::string::string(local_70,(string *)&in_RDI->path);
    File::File(in_stack_fffffffffffffff0,(string *)in_stack_ffffffffffffffe8,
               in_stack_ffffffffffffffe4,(bool)in_stack_ffffffffffffffe3,
               (bool)in_stack_ffffffffffffffe2,(bool)in_stack_ffffffffffffffe1,
               (bool)in_stack_ffffffffffffffe0);
    std::__cxx11::string::~string(local_70);
    uVar1 = File::isValid((File *)&stack0xffffffffffffffb0);
    if ((bool)uVar1) {
      File::lock(in_stack_ffffffffffffff88,(bool)in_stack_ffffffffffffff87);
      in_stack_ffffffffffffff66 = File::isEmpty(in_stack_ffffffffffffffe8);
      if ((bool)in_stack_ffffffffffffff66) {
        in_RDI->stream = in_RDI->stream + 1;
        if (in_RDI->stream == (FILE *)0x0) {
          in_RDI->stream = in_RDI->stream + 1;
        }
        in_RDI->field_0x2d = 0;
        File::writeULong(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
        File::unlock(in_stack_ffffffffffffff78);
      }
      else {
        pFVar2 = (File *)0x0;
        in_stack_ffffffffffffff64 =
             File::readULong(in_stack_ffffffffffffffb8,(unsigned_long *)in_stack_ffffffffffffffb0);
        in_stack_ffffffffffffff63 = false;
        in_stack_ffffffffffffff65 = in_stack_ffffffffffffff64;
        if ((bool)in_stack_ffffffffffffff64) {
          in_stack_ffffffffffffff62 =
               File::seek(in_RDI,CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff66,
                                                         CONCAT15(in_stack_ffffffffffffff64,
                                                                  CONCAT14(in_stack_ffffffffffffff64
                                                                           ,(uint)CONCAT12(
                                                  in_stack_ffffffffffffff62,
                                                  CONCAT11(in_stack_ffffffffffffff61,
                                                           in_stack_ffffffffffffff60)))))));
          in_stack_ffffffffffffff63 = in_stack_ffffffffffffff62;
        }
        this_00 = pFVar2;
        if (((in_RDI->field_0x2d & 1) != 0) &&
           (this_00 = (File *)((long)&pFVar2->_vptr_File + 1), this_00 == (File *)0x0)) {
          this_00 = (File *)((long)&pFVar2->_vptr_File + 2);
        }
        in_stack_ffffffffffffff61 = false;
        if ((bool)in_stack_ffffffffffffff63 != false) {
          in_stack_ffffffffffffff60 =
               File::writeULong(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
          in_stack_ffffffffffffff61 = in_stack_ffffffffffffff60;
        }
        if ((bool)in_stack_ffffffffffffff61 != false) {
          in_RDI->stream = (FILE *)this_00;
          in_RDI->field_0x2d = 0;
        }
        File::unlock(this_00);
      }
    }
    File::~File((File *)CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff66,
                                                CONCAT15(in_stack_ffffffffffffff65,
                                                         CONCAT14(in_stack_ffffffffffffff64,
                                                                  CONCAT13(in_stack_ffffffffffffff63
                                                                           ,CONCAT12(
                                                  in_stack_ffffffffffffff62,
                                                  CONCAT11(in_stack_ffffffffffffff61,
                                                           in_stack_ffffffffffffff60))))))));
    MutexLocker::~MutexLocker
              ((MutexLocker *)
               CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff66,
                                       CONCAT15(in_stack_ffffffffffffff65,
                                                CONCAT14(in_stack_ffffffffffffff64,
                                                         CONCAT13(in_stack_ffffffffffffff63,
                                                                  CONCAT12(in_stack_ffffffffffffff62
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff61,
                                                  in_stack_ffffffffffffff60))))))));
  }
  return;
}

Assistant:

void Generation::commit()
{
	if (isToken)
	{
		MutexLocker lock(genMutex);

		File genFile(path, umask, true, true, true, false);

		if (!genFile.isValid())
		{
			return;
		}

		genFile.lock();

		if (genFile.isEmpty())
		{
			currentValue++;

			if (currentValue == 0)
			{
				currentValue++;
			}

			pendingUpdate = false;

			(void) genFile.writeULong(currentValue);

			genFile.unlock();

			return;
		}

		unsigned long onDisk = 0;

		bool bOK = true;

		bOK = bOK && genFile.readULong(onDisk);
		bOK = bOK && genFile.seek(0L);

		if (pendingUpdate)
		{
			onDisk++;

			if (onDisk == 0)
			{
				onDisk++;
			}
		}

		bOK = bOK && genFile.writeULong(onDisk);

		if (bOK)
		{
			currentValue = onDisk;

			pendingUpdate = false;
		}

		genFile.unlock();
	}
}